

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

void stringify_server_ID(uchar *ID,char *buffer,int len)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *__format;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  char *char_ID;
  
  if (ID == (uchar *)0x0) {
LAB_0011e8cf:
    if (len < 0x1e) {
      return;
    }
    snprintf(buffer,(ulong)(uint)len,"<Unknown format version %d\n",(ulong)*ID);
    return;
  }
  if ((((ID[4] == '\0') && (ID[5] == '\0')) && (ID[6] == '\0')) && (ID[7] == '\0')) {
LAB_0011e88b:
    if (0xf < len) {
      lVar10 = 0;
      iVar4 = 0;
      do {
        iVar3 = snprintf(buffer + iVar4,(long)(len - iVar4),"%2x",(ulong)ID[lVar10]);
        iVar4 = iVar3 + iVar4;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
    }
  }
  else {
    uVar1 = *ID;
    if (uVar1 == '\x02') {
      if (len < 0x4e) {
        return;
      }
      uVar5 = get_rep_len_format_ID(ID);
      uVar6 = (ulong)*ID;
      uVar9 = *(uint *)(ID + 4);
      uVar2 = *(uint *)(ID + 8);
      uVar8 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                     uVar9 << 0x18);
      uVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      __format = "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n";
      uVar7 = (ulong)uVar5;
    }
    else {
      if (uVar1 != '\x01') {
        if (uVar1 != '\0') goto LAB_0011e8cf;
        goto LAB_0011e88b;
      }
      if (len < 0x4e) {
        return;
      }
      uVar9 = *(uint *)(ID + 4);
      uVar7 = (ulong)ID[1];
      uVar8 = (ulong)(ushort)(*(ushort *)(ID + 2) << 8 | *(ushort *)(ID + 2) >> 8);
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      __format = "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n";
      uVar6 = 1;
    }
    snprintf(buffer,(ulong)(uint)len,__format,uVar6,uVar7,uVar8,(ulong)uVar9);
  }
  return;
}

Assistant:

extern void
stringify_server_ID(unsigned char *ID, char *buffer, int len)
{
    int id_size = 8;
    int point = 0;
    int i;
    switch (version_of_format_ID(ID)) {
    case 0:
	if (len < id_size * 2) break;
	for (i = 0; i < id_size; i++) {
	    point += snprintf(&buffer[point], len - point, "%2x", ID[i]);
	}
	break;
    case 1:{
	version_1_format_ID id1;
	memcpy(&id1, ID, 10);
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	snprintf(buffer, len, "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n",
	       id1.version, id1.salt, ntohs(id1.port),
	       ntohl(id1.IP_addr), ntohs(id1.format_identifier));
	    break;
	}
    case 2:{
	version_3_format_ID *id3 = (version_3_format_ID*)ID;
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	int rep_len = get_rep_len_format_ID(ID);
	snprintf(buffer, len, "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n",
	       id3->version, rep_len,
	       ntohl(id3->hash1), ntohl(id3->hash2));
	    break;
	}
    default:
	if (len < 30) return;
	snprintf(buffer, len, "<Unknown format version %d\n",
	       *((unsigned char *) ID));
	break;
    }
}